

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Emote(Map *this,Character *from,Emote emote,bool echo)

{
  Character *other;
  bool bVar1;
  int num;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  
  PacketBuilder::PacketBuilder(&builder,PACKET_EMOTE,PACKET_PLAYER,3);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort(&builder,num);
  PacketBuilder::AddChar(&builder,(uint)emote);
  p_Var2 = (_List_node_base *)&this->characters;
LAB_0015bb2b:
  p_Var2 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var2->_M_next)->_M_impl).
           _M_node.super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)&this->characters) {
    PacketBuilder::~PacketBuilder(&builder);
    return;
  }
  other = (Character *)p_Var2[1]._M_next;
  if (!echo) goto code_r0x0015bb3c;
  goto LAB_0015bb50;
code_r0x0015bb3c:
  if (other != from) {
    bVar1 = Character::InRange(from,other);
    if (bVar1) {
LAB_0015bb50:
      Character::Send(other,&builder);
    }
  }
  goto LAB_0015bb2b;
}

Assistant:

void Map::Emote(Character *from, enum Emote emote, bool echo)
{
	PacketBuilder builder(PACKET_EMOTE, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(emote);

	UTIL_FOREACH(this->characters, character)
	{
		if (!echo && (character == from || !from->InRange(character)))
		{
			continue;
		}

		character->Send(builder);
	}
}